

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpi.cpp
# Opt level: O0

void pg::freeze_thaw_reset_rec_WRAP(WorkerP *w,Task *__dq_head,TD_freeze_thaw_reset_rec *t)

{
  TD_freeze_thaw_reset_rec *t_local;
  Task *__dq_head_local;
  WorkerP *w_local;
  
  freeze_thaw_reset_rec_CALL
            (w,__dq_head,(t->d).args.arg_1,(t->d).args.arg_2,(t->d).args.arg_3,(t->d).args.arg_4);
  return;
}

Assistant:

VOID_TASK_4(freeze_thaw_reset_rec, FPISolver*, solver, int, i, int, n, int, p)
{
    if (n>128) {
        // because dynamic bitset is not thread safe, work in blocks of 64...
        if (i&127) {
            // start not yet aligned
            int N = 128 - (i&127);
            SPAWN(freeze_thaw_reset_rec, solver, i+N, n-N, p);
            solver->freezeThawReset(i, N, p);
            SYNC(freeze_thaw_reset_rec);
        } else {
            int N = (n/128)*64;
            SPAWN(freeze_thaw_reset_rec, solver, i+N, n-N, p);
            CALL(freeze_thaw_reset_rec, solver, i, N, p);
            SYNC(freeze_thaw_reset_rec);
        }
    } else {
        solver->freezeThawReset(i, n, p);
    }
}